

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O1

nsync_time nsync::nsync_time_add(nsync_time a,nsync_time b)

{
  long lVar1;
  long lVar2;
  nsync_time nVar3;
  
  lVar1 = b.tv_nsec + a.tv_nsec;
  lVar2 = b.tv_nsec + -1000000000 + a.tv_nsec;
  if (lVar1 < 1000000000) {
    lVar2 = lVar1;
  }
  nVar3.tv_sec = (ulong)(999999999 < lVar1) + a.tv_sec + b.tv_sec;
  nVar3.tv_nsec = lVar2;
  return nVar3;
}

Assistant:

nsync_time nsync_time_add (nsync_time a, nsync_time b) {
	a.tv_sec += b.tv_sec;
	a.tv_nsec += b.tv_nsec;
	if (a.tv_nsec >= NSYNC_NS_IN_S_) {
		a.tv_nsec -= NSYNC_NS_IN_S_;
		a.tv_sec++;
	}
	return (a);
}